

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_time.c
# Opt level: O0

timeval * zt_sub_time(timeval *st,timeval *t1,timeval *t2)

{
  timeval *t2_local;
  timeval *t1_local;
  timeval *st_local;
  
  st->tv_sec = t1->tv_sec - t2->tv_sec;
  st->tv_usec = t1->tv_usec - t2->tv_usec;
  while (st->tv_usec < 0) {
    st->tv_sec = st->tv_sec + -1;
    st->tv_usec = st->tv_usec + 1000000;
  }
  return st;
}

Assistant:

struct timeval *
zt_sub_time(struct timeval *st, struct timeval *t1, struct timeval *t2)
{
    st->tv_sec = t1->tv_sec - t2->tv_sec;
    st->tv_usec = t1->tv_usec - t2->tv_usec;

    while (st->tv_usec < 0) {
        st->tv_sec--;
        st->tv_usec += 1000000;
    }

    return st;
}